

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O3

void __thiscall
SQCompilation::CodegenVisitor::visitWhileStatement(CodegenVisitor *this,WhileStatement *whileLoop)

{
  SQUnsignedInteger *pSVar1;
  SQScope *pSVar2;
  size_type *psVar3;
  SQInstruction *pSVar4;
  SQObjectPtr *pSVar5;
  bool bVar6;
  size_type sVar7;
  size_type sVar8;
  Node *this_00;
  SQInteger SVar9;
  SQObjectPtr *pSVar10;
  long *plVar11;
  long lVar12;
  SQFuncState *pSVar13;
  uint uVar14;
  SQFuncState *pSVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  SQScope __oldscope___1;
  SQScope __oldscope__;
  SQObjectPtr local_78;
  anon_union_4_2_91d81cc7_for_SQInstruction_0 local_68;
  undefined4 uStack_64;
  SQObjectValue SStack_60;
  ulong local_58;
  ulong local_50;
  SQInteger local_48;
  SQInteger SStack_40;
  
  lVar12 = (long)(whileLoop->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart;
  if (lVar12 != -1) {
    SQFuncState::AddLineInfos(this->_fs,lVar12,this->_lineinfo,false);
  }
  local_48 = (this->_scope).outers;
  SStack_40 = (this->_scope).stacksize;
  pSVar15 = this->_fs;
  (this->_scope).outers = pSVar15->_outers;
  SVar9 = SQFuncState::GetStackSize(pSVar15);
  (this->_scope).stacksize = SVar9;
  local_78.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_78.super_SQObject._type = OT_NULL;
  local_78.super_SQObject._flags = '\0';
  local_78.super_SQObject._5_1_ = '\0';
  local_78.super_SQObject._6_1_ = '\0';
  local_78.super_SQObject._7_1_ = '\0';
  uVar17 = (this->_scopedconsts)._allocated;
  uVar14 = (this->_scopedconsts)._size;
  pSVar10 = (this->_scopedconsts)._vals;
  if (uVar17 <= uVar14) {
    uVar18 = 4;
    if (uVar14 * 2 != 0) {
      uVar18 = (ulong)(uVar14 * 2);
    }
    pSVar10 = (SQObjectPtr *)
              sq_vm_realloc((this->_scopedconsts)._alloc_ctx,pSVar10,(ulong)uVar17 << 4,uVar18 << 4)
    ;
    (this->_scopedconsts)._vals = pSVar10;
    (this->_scopedconsts)._allocated = (size_type)uVar18;
    uVar14 = (this->_scopedconsts)._size;
  }
  (this->_scopedconsts)._size = uVar14 + 1;
  pSVar4 = (SQInstruction *)(pSVar10 + uVar14);
  pSVar4->field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)local_78.super_SQObject._type;
  pSVar4->op = local_78.super_SQObject._flags;
  pSVar4->_arg0 = local_78.super_SQObject._5_1_;
  pSVar4->_arg2 = local_78.super_SQObject._6_1_;
  pSVar4->_arg3 = local_78.super_SQObject._7_1_;
  ((SQObjectValue *)(pSVar4 + 1))->pTable = (SQTable *)local_78.super_SQObject._unVal;
  if ((pSVar10[uVar14].super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((pSVar10[uVar14].super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_78);
  sVar7 = (this->_fs->_instructions)._size;
  this_00 = &whileLoop->_cond->super_Node;
  bVar6 = this->_donot_get;
  this->_donot_get = false;
  Node::visit<SQCompilation::CodegenVisitor>(this_00,this);
  this->_donot_get = bVar6;
  pSVar15 = this->_fs;
  local_58 = (ulong)(pSVar15->_unresolvedbreaks)._size;
  local_50 = (ulong)(pSVar15->_unresolvedcontinues)._size;
  uVar17 = (pSVar15->_breaktargets)._allocated;
  uVar14 = (pSVar15->_breaktargets)._size;
  plVar11 = (pSVar15->_breaktargets)._vals;
  pSVar13 = pSVar15;
  if (uVar17 <= uVar14) {
    uVar18 = 4;
    if (uVar14 * 2 != 0) {
      uVar18 = (ulong)(uVar14 * 2);
    }
    plVar11 = (long *)sq_vm_realloc((pSVar15->_breaktargets)._alloc_ctx,plVar11,(ulong)uVar17 << 3,
                                    uVar18 * 8);
    (pSVar15->_breaktargets)._vals = plVar11;
    (pSVar15->_breaktargets)._allocated = (size_type)uVar18;
    uVar14 = (pSVar15->_breaktargets)._size;
    pSVar13 = this->_fs;
  }
  (pSVar15->_breaktargets)._size = uVar14 + 1;
  plVar11[uVar14] = 0;
  uVar17 = (pSVar13->_continuetargets)._allocated;
  uVar14 = (pSVar13->_continuetargets)._size;
  plVar11 = (pSVar13->_continuetargets)._vals;
  pSVar15 = pSVar13;
  if (uVar17 <= uVar14) {
    uVar18 = 4;
    if (uVar14 * 2 != 0) {
      uVar18 = (ulong)(uVar14 * 2);
    }
    plVar11 = (long *)sq_vm_realloc((pSVar13->_continuetargets)._alloc_ctx,plVar11,
                                    (ulong)uVar17 << 3,uVar18 * 8);
    (pSVar13->_continuetargets)._vals = plVar11;
    (pSVar13->_continuetargets)._allocated = (size_type)uVar18;
    uVar14 = (pSVar13->_continuetargets)._size;
    pSVar15 = this->_fs;
  }
  pSVar2 = &this->_scope;
  (pSVar13->_continuetargets)._size = uVar14 + 1;
  plVar11[uVar14] = 0;
  uVar17 = (pSVar15->_blockstacksizes)._allocated;
  uVar14 = (pSVar15->_blockstacksizes)._size;
  plVar11 = (pSVar15->_blockstacksizes)._vals;
  pSVar13 = pSVar15;
  if (uVar17 <= uVar14) {
    uVar18 = 4;
    if (uVar14 * 2 != 0) {
      uVar18 = (ulong)(uVar14 * 2);
    }
    plVar11 = (long *)sq_vm_realloc((pSVar15->_blockstacksizes)._alloc_ctx,plVar11,
                                    (ulong)uVar17 << 3,uVar18 * 8);
    (pSVar15->_blockstacksizes)._vals = plVar11;
    (pSVar15->_blockstacksizes)._allocated = (size_type)uVar18;
    uVar14 = (pSVar15->_blockstacksizes)._size;
    pSVar13 = this->_fs;
  }
  (pSVar15->_blockstacksizes)._size = uVar14 + 1;
  plVar11[uVar14] = (this->_scope).stacksize;
  SVar9 = SQFuncState::PopTarget(pSVar13);
  local_78.super_SQObject._5_1_ = (char)SVar9;
  local_78.super_SQObject._0_5_ = 0x2700000000;
  local_78.super_SQObject._0_8_ = (ulong)local_78.super_SQObject._4_2_ << 0x20;
  SQFuncState::AddInstruction(pSVar13,(SQInstruction *)&local_78);
  pSVar15 = this->_fs;
  sVar8 = (pSVar15->_instructions)._size;
  local_78.super_SQObject._0_8_ = pSVar2->outers;
  local_78.super_SQObject._unVal = (SQObjectValue)(this->_scope).stacksize;
  (this->_scope).outers = pSVar15->_outers;
  SVar9 = SQFuncState::GetStackSize(pSVar15);
  (this->_scope).stacksize = SVar9;
  SStack_60.pTable = (SQTable *)0x0;
  local_68 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)0x1000001;
  uStack_64._0_1_ = '\0';
  uStack_64._1_1_ = '\0';
  uStack_64._2_1_ = '\0';
  uStack_64._3_1_ = '\0';
  uVar17 = (this->_scopedconsts)._allocated;
  uVar14 = (this->_scopedconsts)._size;
  pSVar10 = (this->_scopedconsts)._vals;
  if (uVar17 <= uVar14) {
    uVar18 = 4;
    if (uVar14 * 2 != 0) {
      uVar18 = (ulong)(uVar14 * 2);
    }
    pSVar10 = (SQObjectPtr *)
              sq_vm_realloc((this->_scopedconsts)._alloc_ctx,pSVar10,(ulong)uVar17 << 4,uVar18 << 4)
    ;
    (this->_scopedconsts)._vals = pSVar10;
    (this->_scopedconsts)._allocated = (size_type)uVar18;
    uVar14 = (this->_scopedconsts)._size;
  }
  uVar17 = sVar7 - 1;
  uVar18 = (ulong)(sVar8 - 1);
  (this->_scopedconsts)._size = uVar14 + 1;
  pSVar5 = pSVar10 + uVar14;
  (pSVar5->super_SQObject)._type = (SQObjectType)local_68;
  (pSVar5->super_SQObject)._flags = (uchar)uStack_64;
  (pSVar5->super_SQObject).field_0x5 = uStack_64._1_1_;
  (pSVar5->super_SQObject).field_0x6 = uStack_64._2_1_;
  (pSVar5->super_SQObject).field_0x7 = uStack_64._3_1_;
  (pSVar5->super_SQObject)._unVal.pTable = (SQTable *)SStack_60;
  if ((pSVar10[uVar14].super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((pSVar10[uVar14].super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_68);
  Node::visit<SQCompilation::CodegenVisitor>
            (&((whileLoop->super_LoopStatement)._body)->super_Node,this);
  lVar12 = this->_fs->_outers;
  SVar9 = SQFuncState::GetStackSize(this->_fs);
  lVar16 = (this->_scope).stacksize;
  if (SVar9 != lVar16) {
    SQFuncState::SetStackSize(this->_fs,lVar16);
    if (lVar12 != this->_fs->_outers) {
      uStack_64._0_1_ = 'G';
      uStack_64._1_1_ = '\0';
      uStack_64._2_1_ = '\0';
      uStack_64._3_1_ = '\0';
      local_68._arg1 = *(anon_union_4_2_91d81cc7_for_SQInstruction_0 *)&(this->_scope).stacksize;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_68);
    }
  }
  pSVar2->outers = local_78.super_SQObject._0_8_;
  (this->_scope).stacksize = (SQInteger)local_78.super_SQObject._unVal;
  uVar14 = (this->_scopedconsts)._size - 1;
  (this->_scopedconsts)._size = uVar14;
  SQObjectPtr::~SQObjectPtr((this->_scopedconsts)._vals + uVar14);
  uStack_64._0_1_ = '\"';
  uStack_64._1_1_ = '\0';
  uStack_64._2_1_ = '\0';
  uStack_64._3_1_ = '\0';
  local_68._arg1 = uVar17 - (this->_fs->_instructions)._size;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_68);
  pSVar15 = this->_fs;
  SQFuncState::SetInstructionParam(pSVar15,uVar18,1,((pSVar15->_instructions)._size - 1) - uVar18);
  pSVar13 = this->_fs;
  uVar18 = (ulong)(pSVar13->_unresolvedcontinues)._size;
  lVar16 = (pSVar13->_unresolvedbreaks)._size - local_58;
  lVar12 = uVar18 - local_50;
  if (lVar12 != 0 && (long)local_50 <= (long)uVar18) {
    ResolveContinues((CodegenVisitor *)pSVar15,pSVar13,lVar12,(ulong)uVar17);
    pSVar13 = this->_fs;
  }
  if (0 < lVar16) {
    ResolveBreaks((CodegenVisitor *)pSVar15,pSVar13,lVar16);
    pSVar13 = this->_fs;
  }
  psVar3 = &(pSVar13->_breaktargets)._size;
  *psVar3 = *psVar3 - 1;
  psVar3 = &(pSVar13->_continuetargets)._size;
  *psVar3 = *psVar3 - 1;
  psVar3 = &(pSVar13->_blockstacksizes)._size;
  *psVar3 = *psVar3 - 1;
  lVar12 = pSVar13->_outers;
  SVar9 = SQFuncState::GetStackSize(pSVar13);
  lVar16 = (this->_scope).stacksize;
  if (SVar9 != lVar16) {
    SQFuncState::SetStackSize(this->_fs,lVar16);
    if (lVar12 != this->_fs->_outers) {
      local_78.super_SQObject._4_4_ = 0x47;
      local_78.super_SQObject._type =
           *(anon_union_4_2_91d81cc7_for_SQInstruction_0 *)&(this->_scope).stacksize;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_78);
    }
  }
  pSVar2->outers = local_48;
  (this->_scope).stacksize = SStack_40;
  uVar17 = (this->_scopedconsts)._size - 1;
  (this->_scopedconsts)._size = uVar17;
  SQObjectPtr::~SQObjectPtr((this->_scopedconsts)._vals + uVar17);
  return;
}

Assistant:

void CodegenVisitor::visitWhileStatement(WhileStatement *whileLoop) {
    addLineNumber(whileLoop);

    BEGIN_SCOPE();
    {
        SQInteger jmppos = _fs->GetCurrentPos();

        visitForceGet(whileLoop->condition());

        BEGIN_BREAKABLE_BLOCK();

        _fs->AddInstruction(_OP_JZ, _fs->PopTarget());

        SQInteger jzpos = _fs->GetCurrentPos();

        BEGIN_SCOPE();

        whileLoop->body()->visit(this);

        END_SCOPE();

        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1);
        _fs->SetInstructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);

        END_BREAKABLE_BLOCK(jmppos);
    }
    END_SCOPE();
}